

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.hpp
# Opt level: O1

ConsumeResult * __thiscall
binlog::Session::consume<binlog::TextOutputStream>
          (ConsumeResult *__return_storage_ptr__,Session *this,TextOutputStream *out)

{
  pointer pcVar1;
  size_t __n;
  pointer psVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *entry;
  _Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_> _Var4;
  void *pvVar5;
  int iVar6;
  size_t sVar7;
  __normal_iterator<std::shared_ptr<binlog::Session::Channel>_*,_std::vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>_>
  __first;
  undefined8 uVar8;
  int __fd;
  size_t in_RCX;
  ConsumeResult *__n_00;
  pointer __buf;
  uint64_t uVar9;
  void *pvVar10;
  void *pvVar11;
  void *__buf_00;
  shared_ptr<binlog::Session::Channel> *channelptr;
  pointer psVar12;
  bool bVar13;
  pthread_mutex_t *local_60;
  
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar6 != 0) {
    uVar8 = std::__throw_system_error(iVar6);
    pthread_mutex_unlock(local_60);
    _Unwind_Resume(uVar8);
  }
  __return_storage_ptr__->channelsPolled = 0;
  __return_storage_ptr__->channelsRemoved = 0;
  __return_storage_ptr__->bytesConsumed = 0;
  __return_storage_ptr__->totalBytesConsumed = 0;
  if (this->_consumeClockSync == true) {
    pcVar1 = (this->_clockSync)._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    TextOutputStream::write
              (out,(int)pcVar1 + 0x18,
               (this->_clockSync)._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish + (-0x18 - (long)pcVar1),in_RCX);
    __return_storage_ptr__->bytesConsumed =
         (size_t)((this->_clockSync)._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl
                  .super__Vector_impl_data._M_finish +
                 (__return_storage_ptr__->bytesConsumed -
                 (long)(this->_clockSync)._vector.super__Vector_base<char,_std::allocator<char>_>.
                       _M_impl.super__Vector_impl_data._M_start) + -0x18);
    this->_consumeClockSync = false;
  }
  pcVar1 = (this->_sources)._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  __n = this->_sourcesConsumePos;
  __buf = (this->_sources)._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish + (-(long)pcVar1 - __n) + -0x18;
  TextOutputStream::write(out,(int)__n + (int)pcVar1 + 0x18,__buf,__n);
  this->_sourcesConsumePos = (streamsize)(__buf + this->_sourcesConsumePos);
  __return_storage_ptr__->bytesConsumed = (size_t)(__buf + __return_storage_ptr__->bytesConsumed);
  psVar12 = (this->_channels).
            super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->_channels).
           super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (psVar12 == psVar2) {
      __first = std::
                __remove_if<__gnu_cxx::__normal_iterator<std::shared_ptr<binlog::Session::Channel>*,std::vector<std::shared_ptr<binlog::Session::Channel>,std::allocator<std::shared_ptr<binlog::Session::Channel>>>>,__gnu_cxx::__ops::_Iter_pred<binlog::Session::consume<binlog::TextOutputStream>(binlog::TextOutputStream&)::_lambda(std::shared_ptr<binlog::Session::Channel>const&)_1_>>
                          ((this->_channels).
                           super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           (this->_channels).
                           super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      std::
      vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
      ::_M_erase(&this->_channels,(iterator)__first._M_current,
                 (this->_channels).
                 super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      sVar7 = this->_totalConsumedBytes + __return_storage_ptr__->bytesConsumed;
      this->_totalConsumedBytes = sVar7;
      __return_storage_ptr__->totalBytesConsumed = sVar7;
      pthread_mutex_unlock((pthread_mutex_t *)this);
      return __return_storage_ptr__;
    }
    p_Var3 = (psVar12->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar13 = false;
    }
    else {
      bVar13 = p_Var3->_M_use_count == 1;
    }
    entry = (psVar12->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr;
    _Var4.super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (entry->_queue)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
         super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
         super__Head_base<0UL,_char_*,_false>;
    pvVar5 = *(void **)((long)_Var4.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x10);
    pvVar10 = *(void **)((long)_Var4.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x30);
    if (pvVar5 < pvVar10) {
      __fd = (int)*(undefined8 *)
                   ((long)_Var4.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x28);
      pvVar11 = (void *)((long)*(void **)((long)_Var4.super__Head_base<0UL,_char_*,_false>.
                                                _M_head_impl + 0x18) - (long)pvVar10);
      __buf_00 = pvVar5;
      iVar6 = __fd;
      if (*(void **)((long)_Var4.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x18) < pvVar10
          || pvVar11 == (void *)0x0) goto LAB_001a5f05;
      iVar6 = (int)pvVar10 + __fd;
      pvVar10 = pvVar5;
      __buf_00 = pvVar11;
    }
    else {
      __buf_00 = (void *)((long)pvVar5 - (long)pvVar10);
      iVar6 = (int)pvVar10 +
              (int)*(undefined8 *)
                    ((long)_Var4.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x28);
LAB_001a5f05:
      pvVar10 = (void *)0x0;
      __fd = 0;
    }
    uVar9 = (long)pvVar10 + (long)__buf_00;
    if (uVar9 != 0) {
      (entry->writerProp).batchSize = uVar9;
      sVar7 = consumeSpecialEntry<binlog::WriterProp,binlog::TextOutputStream>
                        (this,&entry->writerProp,out);
      __return_storage_ptr__->bytesConsumed = __return_storage_ptr__->bytesConsumed + sVar7;
      __n_00 = __return_storage_ptr__;
      TextOutputStream::write(out,iVar6,__buf_00,(size_t)__return_storage_ptr__);
      if (pvVar10 != (void *)0x0) {
        TextOutputStream::write(out,__fd,pvVar10,(size_t)__n_00);
      }
      *(void **)((long)_Var4.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x30) = pvVar5;
      __return_storage_ptr__->bytesConsumed = __return_storage_ptr__->bytesConsumed + uVar9;
    }
    if (bVar13) {
      p_Var3 = (psVar12->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      (psVar12->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)0x0;
      (psVar12->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>).
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      __return_storage_ptr__->channelsRemoved = __return_storage_ptr__->channelsRemoved + 1;
    }
    __return_storage_ptr__->channelsPolled = __return_storage_ptr__->channelsPolled + 1;
    psVar12 = psVar12 + 1;
  } while( true );
}

Assistant:

Session::ConsumeResult Session::consume(OutputStream& out)
{
  // This lock:
  //  - Ensures only a single consumer is running at a time
  //  - Ensures safe read of _channels
  //  - Ensures safe read of Channel::writerProp (written by setChannelWriterName)
  //  - Ensures safe read of _sources
  //  - Ensures no new EventSource can be added to _sources while consuming
  //
  // Without this lock, the following becomes possible:
  //  - Consumer starts, consumes _sources
  //  - Producer1 adds a new elem (ES123) to sources
  //  - Producer2 finds that ES123 is already added
  //  - Producer2 adds a new event using ES123
  //  - Consumer continues, consumes the event added by Producer2
  // This would result in a corrupt stream, as the event source
  // must precede every event referencing it. This is solved by the lock
  // that blocks P1 *and* P2 while adding ES123.
  std::lock_guard<std::mutex> lock(_mutex);

  ConsumeResult result;

  // add a clock sync if not yet added
  if (_consumeClockSync)
  {
    out.write(_clockSync.data(), _clockSync.ssize());
    result.bytesConsumed += std::size_t(_clockSync.ssize());
    _consumeClockSync = false;
  }

  // consume event sources before events
  const std::streamsize sourceWriteSize = _sources.ssize() - _sourcesConsumePos;
  out.write(_sources.data() + _sourcesConsumePos, sourceWriteSize);
  _sourcesConsumePos += sourceWriteSize;
  result.bytesConsumed += std::size_t(sourceWriteSize);

  // consume some events
  for (std::shared_ptr<Channel>& channelptr : _channels)
  {
    // Important to check if channel is closed before beginRead,
    // otherwise the following race becomes possible:
    //  - Consumer finds queue is empty
    //  - Producer adds data
    //  - Producer closes the queue
    //  - Consumer finds queue is closed, removes it -> data loss
    const bool isClosed = (channelptr.use_count() == 1);

    Channel& ch = *channelptr;

    detail::QueueReader reader(ch.queue());
    const detail::QueueReader::ReadResult data = reader.beginRead();
    if (data.size())
    {
      // consume writerProp entry
      ch.writerProp.batchSize = data.size();
      result.bytesConsumed += consumeSpecialEntry(ch.writerProp, out);

      // consume queue data
      out.write(data.buffer1, std::streamsize(data.size1));
      if (data.size2)
      {
        // data wraps around the end of the queue, consume the second half as well
        out.write(data.buffer2, std::streamsize(data.size2));
      }

      reader.endRead();
      result.bytesConsumed += data.size();
    }

    if (isClosed)
    {
      // queue is empty and closed, remove it
      channelptr.reset();
      result.channelsRemoved++;
    }

    result.channelsPolled++;
  }

  // remove empty and closed channels
  _channels.erase(
    std::remove_if(
      _channels.begin(), _channels.end(),
      [](const std::shared_ptr<Channel>& channelptr) { return !channelptr; }
    ),
    _channels.end()
  );

  _totalConsumedBytes += result.bytesConsumed;
  result.totalBytesConsumed = _totalConsumedBytes;

  return result;
}